

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

void falkhash_test_cxx(void *input,int len,uint32_t seed,void *out)

{
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  uint64_t hash [2];
  undefined8 local_28 [2];
  undefined8 *local_18;
  undefined4 local_10;
  int local_c;
  undefined8 local_8;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_28,0,0x10);
  if (local_c == 0) {
    *(undefined4 *)local_18 = 0;
  }
  else {
    falkhash_test(local_8,(long)local_c,local_10,local_28);
    *local_18 = local_28[0];
  }
  return;
}

Assistant:

void
falkhash_test_cxx(const void *input, int len, uint32_t seed, void *out)
{
  uint64_t hash[2] = {0ULL, 0ULL};
  if (!len) {
    *(uint32_t *) out = 0;
    return;
  }
  // objsize: 0-0x108: 264
  falkhash_test((uint8_t *)input, (uint64_t)len, seed, hash);
  *(uint64_t *) out = hash[0];
}